

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.cc
# Opt level: O0

int X509_ALGOR_cmp(X509_ALGOR *a,X509_ALGOR *b)

{
  int rv;
  X509_ALGOR *b_local;
  X509_ALGOR *a_local;
  
  a_local._4_4_ = OBJ_cmp(a->algorithm,b->algorithm);
  if (a_local._4_4_ == 0) {
    if ((a->parameter == (ASN1_TYPE *)0x0) && (b->parameter == (ASN1_TYPE *)0x0)) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = ASN1_TYPE_cmp(a->parameter,b->parameter);
    }
  }
  return a_local._4_4_;
}

Assistant:

int X509_ALGOR_cmp(const X509_ALGOR *a, const X509_ALGOR *b) {
  int rv;
  rv = OBJ_cmp(a->algorithm, b->algorithm);
  if (rv) {
    return rv;
  }
  if (!a->parameter && !b->parameter) {
    return 0;
  }
  return ASN1_TYPE_cmp(a->parameter, b->parameter);
}